

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void __thiscall Server::process_pending_clients(Server *this)

{
  int client_sock;
  int iVar1;
  SOCK5ConnectionMaker *this_00;
  runtime_error *this_01;
  allocator local_55;
  socklen_t addrlen;
  value_type local_50 [2];
  sockaddr_in client_addr;
  
  iVar1 = this->listen_sockfd;
  if (((ulong)(this->rdfds).fds_bits[iVar1 / 0x40] >> ((long)iVar1 % 0x40 & 0x3fU) & 1) != 0) {
    addrlen = 0x10;
    client_sock = accept(iVar1,(sockaddr *)&client_addr,&addrlen);
    iVar1 = this->maxfd;
    if (this->maxfd <= client_sock) {
      iVar1 = client_sock;
    }
    this->maxfd = iVar1;
    if (0x3ff < client_sock) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)local_50,"Socket number out of range for select",&local_55);
      std::runtime_error::runtime_error(this_01,(string *)local_50);
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this_00 = (SOCK5ConnectionMaker *)operator_new(0x840);
    SOCK5ConnectionMaker::SOCK5ConnectionMaker(this_00,client_sock);
    local_50[0].first = client_sock;
    local_50[0].second = this_00;
    std::__cxx11::
    list<std::pair<int,_SOCK5ConnectionMaker_*>,_std::allocator<std::pair<int,_SOCK5ConnectionMaker_*>_>_>
    ::push_back(&this->waitingForHandshake,local_50);
  }
  return;
}

Assistant:

void Server::process_pending_clients() {
    if (FD_ISSET(listen_sockfd, &rdfds)) {
        sockaddr_in client_addr;
        socklen_t addrlen = sizeof(client_addr);
        int client_connection = accept(listen_sockfd, reinterpret_cast<sockaddr *>(&client_addr), &addrlen);
        if (!add_fd(client_connection)) {
            throw std::runtime_error(std::string("Socket number out of range for select"));
        }
        waitingForHandshake.push_back(std::pair<int, SOCK5ConnectionMaker*>(client_connection,new SOCK5ConnectionMaker(client_connection)));
    }
}